

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

void half_to_float_buffer(float *out,uint16_t *in,int w)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = w;
  if (7 < w) {
    do {
      half_to_float4(out,in);
      half_to_float4(out + 4,in + 4);
      out = out + 8;
      in = in + 8;
      w = iVar5 + -8;
      bVar1 = 0xf < iVar5;
      iVar5 = w;
    } while (bVar1);
  }
  switch(w) {
  case 1:
    uVar3 = (uint)(short)*in;
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    *out = fVar4;
    break;
  case 2:
    uVar3 = (uint)(short)*in;
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    *out = fVar4;
    uVar3 = (uint)(short)in[1];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[1] = fVar4;
    break;
  case 3:
    uVar3 = (uint)(short)*in;
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    *out = fVar4;
    uVar3 = (uint)(short)in[1];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[1] = fVar4;
    uVar3 = (uint)(short)in[2];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[2] = fVar4;
    break;
  case 4:
    half_to_float4(out,in);
    return;
  case 5:
    half_to_float4(out,in);
    uVar3 = (uint)(short)in[4];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[4] = fVar4;
    break;
  case 6:
    half_to_float4(out,in);
    uVar3 = (uint)(short)in[4];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[4] = fVar4;
    uVar3 = (uint)(short)in[5];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[5] = fVar4;
    break;
  case 7:
    half_to_float4(out,in);
    uVar3 = (uint)(short)in[4];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[4] = fVar4;
    uVar3 = (uint)(short)in[5];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[5] = fVar4;
    uVar3 = (uint)(short)in[6];
    uVar6 = (uVar3 & 0x7fff) << 0xd;
    fVar4 = (float)(uVar3 & 0x80000000);
    if (uVar6 < 0x800000) {
      if ((uVar3 & 0x7fff) != 0) {
        uVar2 = 0x1f;
        if ((uVar3 & 0x7fff) != 0) {
          for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar5 = (uVar2 ^ 0x1f) - 8;
        fVar4 = (float)(((uint)fVar4 | uVar6 << ((byte)iVar5 & 0x1f) | 0x38800000) +
                       iVar5 * -0x800000);
      }
    }
    else if (uVar6 < 0xf800000) {
      fVar4 = (float)(((uint)fVar4 | uVar6) + 0x38000000);
    }
    else {
      fVar4 = (float)((uint)fVar4 | uVar6 | 0x7f800000);
    }
    out[6] = fVar4;
  }
  return;
}

Assistant:

static inline void
half_to_float_buffer (float* out, const uint16_t* in, int w)
{
#    if EXR_HOST_IS_NOT_LITTLE_ENDIAN
    for (int x = 0; x < w; ++x)
        out[x] = half_to_float (one_to_native16 (in[x]));
#    else
    while (w >= 8)
    {
        half_to_float8 (out, in);
        out += 8;
        in += 8;
        w -= 8;
    }
    switch (w)
    {
        case 7:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            out[5] = half_to_float (in[5]);
            out[6] = half_to_float (in[6]);
            break;
        case 6:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            out[5] = half_to_float (in[5]);
            break;
        case 5:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            break;
        case 4: half_to_float4 (out, in); break;
        case 3:
            out[0] = half_to_float (in[0]);
            out[1] = half_to_float (in[1]);
            out[2] = half_to_float (in[2]);
            break;
        case 2:
            out[0] = half_to_float (in[0]);
            out[1] = half_to_float (in[1]);
            break;
        case 1: out[0] = half_to_float (in[0]); break;
    }
#    endif
}